

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

FeatureOptions<wasm::BinaryOp> * __thiscall
wasm::Random::FeatureOptions<wasm::BinaryOp>::add<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
          (FeatureOptions<wasm::BinaryOp> *this,FeatureSet feature,BinaryOp option,BinaryOp rest,
          BinaryOp rest_1,BinaryOp rest_2)

{
  iterator __position;
  vector<wasm::BinaryOp,std::allocator<wasm::BinaryOp>> *this_00;
  FeatureOptions<wasm::BinaryOp> *pFVar1;
  key_type local_30;
  BinaryOp local_2c;
  FeatureSet feature_local;
  BinaryOp option_local;
  
  local_30.features = feature.features;
  local_2c = option;
  this_00 = (vector<wasm::BinaryOp,std::allocator<wasm::BinaryOp>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>_>_>_>
            ::operator[](&this->options,&local_30);
  __position._M_current = *(BinaryOp **)(this_00 + 8);
  if (__position._M_current == *(BinaryOp **)(this_00 + 0x10)) {
    std::vector<wasm::BinaryOp,std::allocator<wasm::BinaryOp>>::
    _M_realloc_insert<wasm::BinaryOp_const&>(this_00,__position,&local_2c);
  }
  else {
    *__position._M_current = local_2c;
    *(BinaryOp **)(this_00 + 8) = __position._M_current + 1;
  }
  pFVar1 = add<wasm::BinaryOp,wasm::BinaryOp>(this,(FeatureSet)local_30.features,rest,rest_1,rest_2)
  ;
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }